

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O0

void mocker::anon_unknown_0::genCall
               (Section *text,FuncSelectionContext *ctx,shared_ptr<mocker::ir::Call> *p)

{
  allocator<std::shared_ptr<mocker::nasm::Register>_> *this;
  initializer_list<std::shared_ptr<mocker::nasm::Register>_> __l;
  __node_base _Var1;
  shared_ptr<mocker::ir::Call> *psVar2;
  FuncSelectionContext *pFVar3;
  int iVar4;
  shared_ptr<mocker::nasm::Register> *psVar5;
  element_type *peVar6;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  *pvVar7;
  _Hash_node_base *p_Var8;
  const_reference args;
  size_type sVar9;
  string *ident;
  __shared_ptr *this_00;
  shared_ptr<mocker::ir::Reg> *__r;
  bool bVar10;
  shared_ptr<mocker::nasm::Register> *local_1f0;
  shared_ptr<mocker::ir::Addr> local_188;
  undefined1 local_178 [8];
  shared_ptr<mocker::nasm::Addr> retVal;
  undefined1 local_148 [24];
  string local_130 [32];
  undefined1 local_110 [8];
  shared_ptr<mocker::nasm::Register> tmp;
  undefined1 local_f8 [4];
  int i_1;
  __node_base local_e8;
  size_t i;
  string local_d8 [32];
  undefined1 local_b8 [8];
  shared_ptr<mocker::nasm::Register> rspCopy;
  undefined1 local_90 [32];
  shared_ptr<mocker::nasm::Register> local_70;
  shared_ptr<mocker::nasm::Register> local_60;
  shared_ptr<mocker::nasm::Register> local_50;
  shared_ptr<mocker::nasm::Register> local_40;
  shared_ptr<mocker::nasm::Register> local_30;
  __shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  shared_ptr<mocker::ir::Call> *p_local;
  FuncSelectionContext *ctx_local;
  Section *text_local;
  
  local_20 = (__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)p;
  p_local = (shared_ptr<mocker::ir::Call> *)ctx;
  ctx_local = (FuncSelectionContext *)text;
  if (((anonymous_namespace)::
       genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
       ::ParamRegs == '\0') &&
     (iVar4 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
                                   ::ParamRegs), iVar4 != 0)) {
    psVar5 = nasm::rdi();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)local_90,psVar5);
    psVar5 = nasm::rsi();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)(local_90 + 0x10),psVar5);
    psVar5 = nasm::rdx();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_70,psVar5);
    psVar5 = nasm::rcx();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_60,psVar5);
    psVar5 = nasm::r8();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_50,psVar5);
    psVar5 = nasm::r9();
    std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_40,psVar5);
    local_30.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_90;
    local_30.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x6;
    this = (allocator<std::shared_ptr<mocker::nasm::Register>_> *)
           ((long)&rspCopy.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 3);
    std::allocator<std::shared_ptr<mocker::nasm::Register>_>::allocator(this);
    __l._M_len = (size_type)
                 local_30.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    __l._M_array = (iterator)
                   local_30.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
    std::
    vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::vector(&genCall::ParamRegs,__l,this);
    std::allocator<std::shared_ptr<mocker::nasm::Register>_>::~allocator
              ((allocator<std::shared_ptr<mocker::nasm::Register>_> *)
               ((long)&rspCopy.
                       super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 3));
    local_1f0 = &local_30;
    do {
      local_1f0 = local_1f0 + -1;
      std::shared_ptr<mocker::nasm::Register>::~shared_ptr(local_1f0);
    } while (local_1f0 != (shared_ptr<mocker::nasm::Register> *)local_90);
    __cxa_atexit(std::
                 vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ::~vector,&genCall::ParamRegs,&__dso_handle);
    __cxa_guard_release(&(anonymous_namespace)::
                         genCall(mocker::nasm::Section&,mocker::(anonymous_namespace)::FuncSelectionContext&,std::shared_ptr<mocker::ir::Call>const&)
                         ::ParamRegs);
  }
  psVar2 = p_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"",(allocator<char> *)((long)&i + 7));
  FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_b8,(string *)psVar2);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  pFVar3 = ctx_local;
  psVar5 = nasm::rsp();
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>const&>
            ((Section *)pFVar3,(shared_ptr<mocker::nasm::Register> *)local_b8,psVar5);
  local_e8._M_nxt = (_Hash_node_base *)0x0;
  while( true ) {
    _Var1._M_nxt = local_e8._M_nxt;
    bVar10 = false;
    if (local_e8._M_nxt < (_Hash_node_base *)0x6) {
      peVar6 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_20);
      pvVar7 = ir::Call::getArgs(peVar6);
      p_Var8 = (_Hash_node_base *)
               std::
               vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
               ::size(pvVar7);
      bVar10 = _Var1._M_nxt < p_Var8;
    }
    pFVar3 = ctx_local;
    if (!bVar10) break;
    args = std::
           vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
           ::operator[](&genCall::ParamRegs,(size_type)local_e8._M_nxt);
    psVar2 = p_local;
    peVar6 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    pvVar7 = ir::Call::getArgs(peVar6);
    std::
    vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
    operator[](pvVar7,(size_type)local_e8._M_nxt);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_f8,(shared_ptr<mocker::ir::Addr> *)psVar2);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Addr>>
              ((Section *)pFVar3,args,(shared_ptr<mocker::nasm::Addr> *)local_f8);
    std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_f8);
    local_e8._M_nxt = (_Hash_node_base *)((long)&(local_e8._M_nxt)->_M_nxt + 1);
  }
  peVar6 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_20);
  pvVar7 = ir::Call::getArgs(peVar6);
  sVar9 = std::
          vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ::size(pvVar7);
  tmp.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = (int)sVar9;
  while (pFVar3 = ctx_local, psVar2 = p_local,
        tmp.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ._4_4_ = tmp.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._4_4_ + -1,
        5 < tmp.super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_130,"",(allocator<char> *)(local_148 + 0x17));
    FuncSelectionContext::newVirtualReg((FuncSelectionContext *)local_110,(string *)psVar2);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)(local_148 + 0x17));
    pFVar3 = ctx_local;
    psVar2 = p_local;
    peVar6 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    pvVar7 = ir::Call::getArgs(peVar6);
    std::
    vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
    operator[](pvVar7,(long)tmp.
                            super___shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi._4_4_);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_148,(shared_ptr<mocker::ir::Addr> *)psVar2);
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Addr>>
              ((Section *)pFVar3,(shared_ptr<mocker::nasm::Register> *)local_110,
               (shared_ptr<mocker::nasm::Addr> *)local_148);
    std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_148);
    nasm::Section::emplaceInst<mocker::nasm::Push,std::shared_ptr<mocker::nasm::Register>&>
              ((Section *)ctx_local,(shared_ptr<mocker::nasm::Register> *)local_110);
    std::shared_ptr<mocker::nasm::Register>::~shared_ptr
              ((shared_ptr<mocker::nasm::Register> *)local_110);
  }
  peVar6 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_20);
  ident = ir::Call::getFuncName_abi_cxx11_(peVar6);
  renameIdentifier((string *)
                   &retVal.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,ident);
  nasm::Section::emplaceInst<mocker::nasm::Call,std::__cxx11::string>
            ((Section *)pFVar3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &retVal.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__cxx11::string::~string
            ((string *)
             &retVal.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  peVar6 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_20);
  this_00 = (__shared_ptr *)ir::Definition::getDest(&peVar6->super_Definition);
  bVar10 = std::__shared_ptr::operator_cast_to_bool(this_00);
  psVar2 = p_local;
  if (bVar10) {
    peVar6 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(local_20);
    __r = ir::Definition::getDest(&peVar6->super_Definition);
    std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>(&local_188,__r);
    FuncSelectionContext::getIrAddr
              ((FuncSelectionContext *)local_178,(shared_ptr<mocker::ir::Addr> *)psVar2);
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr(&local_188);
    pFVar3 = ctx_local;
    psVar5 = nasm::rax();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Addr>&,std::shared_ptr<mocker::nasm::Register>const&>
              ((Section *)pFVar3,(shared_ptr<mocker::nasm::Addr> *)local_178,psVar5);
    std::shared_ptr<mocker::nasm::Addr>::~shared_ptr((shared_ptr<mocker::nasm::Addr> *)local_178);
  }
  peVar6 = std::__shared_ptr_access<mocker::ir::Call,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(local_20);
  pvVar7 = ir::Call::getArgs(peVar6);
  sVar9 = std::
          vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ::size(pvVar7);
  pFVar3 = ctx_local;
  if (6 < sVar9) {
    psVar5 = nasm::rsp();
    nasm::Section::
    emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::Register>const&,std::shared_ptr<mocker::nasm::Register>&>
              ((Section *)pFVar3,psVar5,(shared_ptr<mocker::nasm::Register> *)local_b8);
  }
  std::shared_ptr<mocker::nasm::Register>::~shared_ptr
            ((shared_ptr<mocker::nasm::Register> *)local_b8);
  return;
}

Assistant:

void genCall(nasm::Section &text, FuncSelectionContext &ctx,
             const std::shared_ptr<ir::Call> &p) {
  static const std::vector<std::shared_ptr<nasm::Register>> ParamRegs = {
      nasm::rdi(), nasm::rsi(), nasm::rdx(),
      nasm::rcx(), nasm::r8(),  nasm::r9()};
  auto rspCopy = ctx.newVirtualReg();
  text.emplaceInst<nasm::Mov>(rspCopy, nasm::rsp());

  for (std::size_t i = 0; i < 6 && i < p->getArgs().size(); ++i) {
    text.emplaceInst<nasm::Mov>(ParamRegs[i], ctx.getIrAddr(p->getArgs()[i]));
  }
  for (int i = p->getArgs().size() - 1; i >= 6; --i) {
    auto tmp = ctx.newVirtualReg();
    text.emplaceInst<nasm::Mov>(tmp, ctx.getIrAddr(p->getArgs()[i]));
    text.emplaceInst<nasm::Push>(tmp);
  }

  text.emplaceInst<nasm::Call>(renameIdentifier(p->getFuncName()));
  if (p->getDest()) {
    auto retVal = ctx.getIrAddr(p->getDest());
    text.emplaceInst<nasm::Mov>(retVal, nasm::rax());
  }

  if (p->getArgs().size() > 6) {
    text.emplaceInst<nasm::Mov>(nasm::rsp(), rspCopy);
  }
}